

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTriangleSphere.h
# Opt level: O0

void __thiscall
pzgeom::TPZTriangleSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>_>::X<double>
          (TPZTriangleSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>_> *this,
          TPZFMatrix<double> *cornerco,TPZVec<double> *loc,TPZVec<double> *result)

{
  double dVar1;
  double *pdVar2;
  TPZVec<double> *in_RCX;
  long in_RDI;
  double dVar3;
  double dVar4;
  int i_1;
  TPZManVector<double,_3> Xsphere;
  int i;
  double NormValue;
  TPZManVector<double,_3> Xc;
  TPZManVector<double,_3> XtminusXc;
  TPZManVector<double,_3> xqsi;
  TPZVec<double> *in_stack_00000af8;
  TPZVec<double> *in_stack_00000b00;
  TPZFMatrix<double> *in_stack_00000b08;
  TPZGeoBlend<pzgeom::TPZGeoTriangle> *in_stack_00000b10;
  TPZManVector<double,_3> *in_stack_fffffffffffffe40;
  double *in_stack_fffffffffffffe60;
  int64_t in_stack_fffffffffffffe68;
  TPZManVector<double,_3> *in_stack_fffffffffffffe70;
  TPZVec<double> *in_stack_fffffffffffffe78;
  TPZManVector<double,_3> *in_stack_fffffffffffffe80;
  int local_13c;
  int local_f4;
  double local_f0;
  TPZVec<double> local_e8 [2];
  undefined8 local_a0;
  TPZVec<double> local_98;
  undefined8 local_60;
  TPZVec<double> local_58;
  TPZVec<double> *local_20;
  
  local_60 = 0;
  local_20 = in_RCX;
  TPZManVector<double,_3>::TPZManVector
            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  local_a0 = 0;
  TPZManVector<double,_3>::TPZManVector
            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  TPZGeoBlend<pzgeom::TPZGeoTriangle>::X<double>
            (in_stack_00000b10,in_stack_00000b08,in_stack_00000b00,in_stack_00000af8);
  TPZManVector<double,_3>::TPZManVector(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  local_f0 = 0.0;
  for (local_f4 = 0; local_f4 < 3; local_f4 = local_f4 + 1) {
    pdVar2 = TPZVec<double>::operator[](&local_58,(long)local_f4);
    dVar3 = *pdVar2;
    pdVar2 = TPZVec<double>::operator[](local_e8,(long)local_f4);
    dVar1 = *pdVar2;
    pdVar2 = TPZVec<double>::operator[](&local_98,(long)local_f4);
    *pdVar2 = dVar3 - dVar1;
    pdVar2 = TPZVec<double>::operator[](&local_98,(long)local_f4);
    in_stack_fffffffffffffe70 = (TPZManVector<double,_3> *)*pdVar2;
    pdVar2 = TPZVec<double>::operator[](&local_98,(long)local_f4);
    local_f0 = (double)in_stack_fffffffffffffe70 * *pdVar2 + local_f0;
  }
  dVar3 = sqrt(local_f0);
  TPZManVector<double,_3>::TPZManVector
            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  for (local_13c = 0; local_13c < 3; local_13c = local_13c + 1) {
    dVar4 = *(double *)(in_RDI + 0x8e0) / dVar3;
    pdVar2 = TPZVec<double>::operator[](&local_98,(long)local_13c);
    dVar1 = *pdVar2;
    pdVar2 = TPZVec<double>::operator[](local_e8,(long)local_13c);
    in_stack_fffffffffffffe40 = (TPZManVector<double,_3> *)(dVar4 * dVar1 + *pdVar2);
    pdVar2 = TPZVec<double>::operator[](local_20,(long)local_13c);
    *pdVar2 = (double)in_stack_fffffffffffffe40;
  }
  TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffffe40);
  TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffffe40);
  TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffffe40);
  TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffffe40);
  return;
}

Assistant:

void X(TPZFMatrix<REAL> &cornerco,TPZVec<T> &loc,TPZVec<T> &result) const
        {
//            TPZFNMatrix<3*NNodes> coord(3,NNodes);
//            CornerCoordinates(gel, coord);
//            X(coord,loc,result);
            
            
            TPZManVector<T,3> xqsi(3,0.); // will store (x,y,z) from (qsi,eta)
            TPZManVector<T,3> XtminusXc(3,0.0); // will store (x,y,z)-xc
            GeomTriang::X(cornerco,loc,xqsi);
            TPZManVector<REAL,3> Xc = fXc;
            
            T NormValue = 0.0;
            
            for (int i = 0; i < 3; i++) {
                XtminusXc[i] = xqsi[i] - Xc[i];
                NormValue += XtminusXc[i]*XtminusXc[i];
            }
            
//            XtminusXc[0,0)= xqsi[0] - Xc[0];
//            XtminusXc(1,0)= xqsi[1] - Xc[1];
//            XtminusXc(2,0)= xqsi[2] - Xc[2];
            
            NormValue = sqrt(NormValue);
            
            TPZManVector<T,3> Xsphere(3,0.0);
            for(int i=0; i<3; i++)
            {
                result[i] = (fR/NormValue)*(XtminusXc[i])+ Xc[i];
            }
//            Xsphere[0] = (fR/NormValue)*(XtminusXc(0,0)+Xc[0]);
//            Xsphere[1] = (fR/NormValue)*(XtminusXc(1,0)+Xc[1]);
//            Xsphere[2] = (fR/NormValue)*(XtminusXc(2,0)+Xc[2]);		
//            result=Xsphere;
            
            
        }